

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O3

HighsDebugStatus __thiscall HEkk::debugComputeDual(HEkk *this,bool initialise)

{
  HighsOptions *pHVar1;
  pointer pcVar2;
  pointer pdVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  HighsInt vecDim;
  ulong __n;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  vector<double,_std::allocator<double>_> delta_dual;
  vector<double,_std::allocator<double>_> new_dual;
  vector<double,_std::allocator<double>_> local_a8;
  vector<double,_std::allocator<double>_> local_90;
  string local_78;
  string local_58;
  value_type_conflict1 local_38;
  
  if (debugComputeDual(bool)::previous_dual == '\0') {
    debugComputeDual();
  }
  if (initialise) {
    std::vector<double,_std::allocator<double>_>::operator=
              (&debugComputeDual::previous_dual,&(this->info_).workDual_);
  }
  else {
    lVar4 = (long)(this->lp_).num_row_;
    if (lVar4 < 1) {
      dVar12 = 0.0;
    }
    else {
      dVar12 = 0.0;
      lVar5 = 0;
      do {
        iVar7 = (this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar5];
        dVar9 = ABS((this->info_).workCost_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar7] +
                    (this->info_).workShift_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar7]);
        if (dVar12 <= dVar9) {
          dVar12 = dVar9;
        }
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
    pHVar1 = this->options_;
    std::vector<double,_std::allocator<double>_>::vector(&local_90,&(this->info_).workDual_);
    local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    __n = (long)(this->lp_).num_row_ + (long)(this->lp_).num_col_;
    local_38 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign(&local_a8,__n,&local_38);
    pdVar3 = debugComputeDual::previous_dual.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    vecDim = (HighsInt)__n;
    if (0 < vecDim) {
      dVar9 = 0.0;
      uVar6 = 0;
      do {
        if (((this->basis_).nonbasicFlag_.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start[uVar6] != '\0') &&
           (dVar10 = ABS((this->info_).workCost_.super__Vector_base<double,_std::allocator<double>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar6] +
                         (this->info_).workShift_.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar6]), dVar9 <= dVar10)) {
          dVar9 = dVar10;
        }
        uVar6 = uVar6 + 1;
      } while ((__n & 0xffffffff) != uVar6);
      if (0 < vecDim) {
        dVar11 = (dVar12 + dVar9) * 0.5 * 1e-16;
        dVar10 = 1e-16;
        if (1e-16 <= dVar11) {
          dVar10 = dVar11;
        }
        pcVar2 = (this->basis_).nonbasicFlag_.
                 super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar8 = 0;
        iVar7 = 0;
        uVar6 = 0;
        do {
          if (pcVar2[uVar8] == '\0') {
            pdVar3[uVar8] = 0.0;
            local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8] = 0.0;
          }
          else if (dVar10 <= ABS(local_90.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar8] - pdVar3[uVar8])) {
            local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8] =
                 local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar8] - pdVar3[uVar8];
            dVar11 = (pHVar1->super_HighsOptionsStruct).dual_feasibility_tolerance;
            if ((dVar11 < ABS(pdVar3[uVar8])) &&
               (dVar11 < ABS(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar8]))) {
              uVar6 = (ulong)((int)uVar6 +
                             (uint)(pdVar3[uVar8] *
                                    local_90.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start[uVar8] < 0.0));
            }
            iVar7 = iVar7 + 1;
          }
          uVar8 = uVar8 + 1;
        } while ((__n & 0xffffffff) != uVar8);
        if (iVar7 != 0) {
          printf("\nHEkk::debugComputeDual Iteration %d: Number of dual sign changes = %d\n",
                 (ulong)(uint)this->iteration_count_,uVar6);
          printf("   |cB| = %g; |cN| = %g; zero delta dual = %g\n",dVar12,dVar9,dVar10);
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Delta duals","");
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Unknown","");
          analyseVectorValues(&(pHVar1->super_HighsOptionsStruct).log_options,&local_58,vecDim,
                              &local_a8,false,&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p);
          }
        }
      }
    }
    if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return kOk;
}

Assistant:

HighsDebugStatus HEkk::debugComputeDual(const bool initialise) const {
  static vector<double> previous_dual;
  const HighsSimplexInfo& info = this->info_;
  if (initialise) {
    previous_dual = info.workDual_;
    return HighsDebugStatus::kOk;
  }
  const HighsOptions& options = *(this->options_);
  //  if (options.highs_debug_level < kHighsDebugLevelCheap) return
  //  HighsDebugStatus::kNotChecked;
  const HighsLp& lp = this->lp_;
  const SimplexBasis& basis = this->basis_;

  double norm_basic_costs = 0;
  for (HighsInt iRow = 0; iRow < lp_.num_row_; iRow++) {
    const double value = info.workCost_[basis.basicIndex_[iRow]] +
                         info.workShift_[basis.basicIndex_[iRow]];
    norm_basic_costs = max(fabs(value), norm_basic_costs);
  }

  vector<double> new_dual = info.workDual_;
  vector<double> delta_dual;
  HighsInt num_tot = lp.num_col_ + lp.num_row_;
  delta_dual.assign(num_tot, 0);
  HighsInt num_dual_sign_change = 0;
  HighsInt num_delta_dual_values = 0;
  double norm_nonbasic_costs = 0;
  for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
    if (!basis.nonbasicFlag_[iVar]) continue;
    double value = info.workCost_[iVar] + info.workShift_[iVar];
    norm_nonbasic_costs = max(fabs(value), norm_nonbasic_costs);
  }

  const double zero_delta_dual =
      max(0.5 * (norm_basic_costs + norm_nonbasic_costs) * 1e-16, 1e-16);
  for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
    if (!basis.nonbasicFlag_[iVar]) {
      previous_dual[iVar] = 0;
      new_dual[iVar] = 0;
      continue;
    }
    double delta = new_dual[iVar] - previous_dual[iVar];
    if (fabs(delta) < zero_delta_dual) continue;
    delta_dual[iVar] = delta;
    const bool sign_change =
        fabs(previous_dual[iVar]) > options.dual_feasibility_tolerance &&
        fabs(new_dual[iVar]) > options.dual_feasibility_tolerance &&
        previous_dual[iVar] * new_dual[iVar] < 0;
    if (sign_change) num_dual_sign_change++;
    num_delta_dual_values++;
  }
  if (num_delta_dual_values) {
    printf(
        "\nHEkk::debugComputeDual Iteration %d: Number of dual sign changes = "
        "%d\n",
        (int)iteration_count_, (int)num_dual_sign_change);
    printf("   |cB| = %g; |cN| = %g; zero delta dual = %g\n", norm_basic_costs,
           norm_nonbasic_costs, zero_delta_dual);
    //    analyseVectorValues(&options.log_options, "Previous duals", num_tot,
    //    previous_dual); analyseVectorValues(&options.log_options, "New duals",
    //    num_tot, new_dual);
    analyseVectorValues(&options.log_options, "Delta duals", num_tot,
                        delta_dual);
  }
  return HighsDebugStatus::kOk;
}